

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_3d__format__hint
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__image_format_hint_channels_enum EVar2;
  ENUM__image_format_hint_range_enum EVar3;
  ENUM__image_format_hint_precision_enum EVar4;
  ParserTemplateBase *this_00;
  ParserChar *buffer;
  long *in_RSI;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  create_3d__format__hint__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined5 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  StringHash in_stack_ffffffffffffffb8;
  StringHash in_stack_ffffffffffffffc0;
  bool *failed_00;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL15::create_3d__format__hint__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  CONCAT15(in_stack_ffffffffffffffad,
                                                           in_stack_ffffffffffffffa8))));
  buffer = (ParserChar *)*in_RSI;
  if (buffer == (ParserChar *)0x0) {
LAB_009fe7be:
    if ((*(int *)&(this_00->super_Parser)._vptr_Parser == 7) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else if ((*(int *)((long)&(this_00->super_Parser)._vptr_Parser + 4) == 6) &&
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        failed_00 = *(bool **)buffer;
        if (failed_00 == (bool *)0x0) {
          in_stack_ffffffffffffffc0 = 0;
          goto LAB_009fe7be;
        }
        in_stack_ffffffffffffffb8 = GeneratedSaxParser::Utils::calculateStringHash(failed_00);
        if (buffer + 8 == (ParserChar *)0x0) {
          return false;
        }
        in_stack_ffffffffffffffb0 = *(ParserTemplateBase **)(buffer + 8);
        buffer = buffer + 0x10;
        if (in_stack_ffffffffffffffb8 == 0x7884d5) break;
        if (in_stack_ffffffffffffffb8 == 0x7a6795) {
          (this_00->super_Parser).mErrorHandler = (IErrorHandler *)in_stack_ffffffffffffffb0;
        }
        else if (in_stack_ffffffffffffffb8 == 0xba0e9de) {
          EVar4 = GeneratedSaxParser::Utils::
                  toEnum<COLLADASaxFWL15::ENUM__image_format_hint_precision_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__image_format_hint_precision_enum)5>
                            (buffer,failed_00,
                             (pair<unsigned_long,_COLLADASaxFWL15::ENUM__image_format_hint_precision_enum>
                              *)0xba0e9de,
                             (_func_unsigned_long_ParserChar_ptr_bool_ptr *)
                             in_stack_ffffffffffffffb0);
          *(ENUM__image_format_hint_precision_enum *)&(this_00->super_Parser).mSaxParser = EVar4;
          if (((in_stack_ffffffffffffffad & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                 (StringHash)failed_00,in_stack_ffffffffffffffb8,
                                 (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
            return false;
          }
        }
        else if (in_stack_ffffffffffffffb8 == 0xe854ea3) {
          EVar2 = GeneratedSaxParser::Utils::
                  toEnum<COLLADASaxFWL15::ENUM__image_format_hint_channels_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__image_format_hint_channels_enum)6>
                            (buffer,failed_00,
                             (pair<unsigned_long,_COLLADASaxFWL15::ENUM__image_format_hint_channels_enum>
                              *)0xe854ea3,
                             (_func_unsigned_long_ParserChar_ptr_bool_ptr *)
                             in_stack_ffffffffffffffb0);
          *(ENUM__image_format_hint_channels_enum *)&(this_00->super_Parser)._vptr_Parser = EVar2;
          if (((in_stack_ffffffffffffffaf & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                 (StringHash)failed_00,in_stack_ffffffffffffffb8,
                                 (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
            return false;
          }
        }
        else {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098
                             ,in_stack_00000090,in_stack_00000088);
          if (bVar1) {
            return false;
          }
        }
      }
      EVar3 = GeneratedSaxParser::Utils::
              toEnum<COLLADASaxFWL15::ENUM__image_format_hint_range_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__image_format_hint_range_enum)5>
                        (buffer,failed_00,
                         (pair<unsigned_long,_COLLADASaxFWL15::ENUM__image_format_hint_range_enum> *
                         )0x7884d5,
                         (_func_unsigned_long_ParserChar_ptr_bool_ptr *)in_stack_ffffffffffffffb0);
      *(ENUM__image_format_hint_range_enum *)((long)&(this_00->super_Parser)._vptr_Parser + 4) =
           EVar3;
    } while (((in_stack_ffffffffffffffae & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                (StringHash)failed_00,in_stack_ffffffffffffffb8,
                                (ParserChar *)in_stack_ffffffffffffffb0), !bVar1));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_3d__format__hint( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_3d__format__hint( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_3d__format__hint__AttributeData* attributeData = newData<create_3d__format__hint__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CHANNELS:
    {
bool failed;
attributeData->channels = Utils::toEnum<ENUM__image_format_hint_channels_enum, StringHash, ENUM__image_format_hint_channels_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_channels_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_CHANNELS,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_RANGE:
    {
bool failed;
attributeData->range = Utils::toEnum<ENUM__image_format_hint_range_enum, StringHash, ENUM__image_format_hint_range_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_range_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_RANGE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PRECISION:
    {
bool failed;
attributeData->precision = Utils::toEnum<ENUM__image_format_hint_precision_enum, StringHash, ENUM__image_format_hint_precision_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_precision_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_PRECISION,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_SPACE:
    {

attributeData->space = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_HINT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->channels == ENUM__image_format_hint_channels_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_CHANNELS, 0 ) )
        return false;
}
if ( attributeData->range == ENUM__image_format_hint_range_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_RANGE, 0 ) )
        return false;
}


    return true;
}